

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UCharsTrieBuilder::writeValueAndFinal(UCharsTrieBuilder *this,int32_t i,UBool isFinal)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  ssize_t sVar3;
  ushort uVar4;
  undefined7 in_register_00000011;
  UChar intUnits [3];
  undefined8 uStack_8;
  
  if ((uint)i < 0x4000) {
    UNRECOVERED_JUMPTABLE = (this->super_StringTrieBuilder).super_UObject._vptr_UObject[0xf];
    iVar1 = (*UNRECOVERED_JUMPTABLE)
                      (this,(ulong)(uint)((int)isFinal << 0xf | i),
                       CONCAT71(in_register_00000011,isFinal),UNRECOVERED_JUMPTABLE);
    return iVar1;
  }
  if ((uint)i < 0x3fff0000) {
    uVar4 = (ushort)((uint)i >> 0x10) | 0x4000;
    uVar2 = 2;
    uStack_8 = in_RAX;
  }
  else {
    uStack_8 = CONCAT26((short)i,(int6)in_RAX);
    uVar2 = 3;
    uVar4 = 0x7fff;
    i = (uint)i >> 0x10;
  }
  uStack_8 = CONCAT44(CONCAT22(uStack_8._6_2_,(short)i),
                      CONCAT22(uVar4 | (ushort)(byte)isFinal << 0xf,(undefined2)uStack_8));
  sVar3 = write(this,(int)&uStack_8 + 2,(void *)(ulong)uVar2,(ulong)(byte)isFinal << 0xf);
  return (int32_t)sVar3;
}

Assistant:

int32_t
UCharsTrieBuilder::writeValueAndFinal(int32_t i, UBool isFinal) {
    if(0<=i && i<=UCharsTrie::kMaxOneUnitValue) {
        return write(i|(isFinal<<15));
    }
    UChar intUnits[3];
    int32_t length;
    if(i<0 || i>UCharsTrie::kMaxTwoUnitValue) {
        intUnits[0]=(UChar)(UCharsTrie::kThreeUnitValueLead);
        intUnits[1]=(UChar)((uint32_t)i>>16);
        intUnits[2]=(UChar)i;
        length=3;
    // } else if(i<=UCharsTrie::kMaxOneUnitValue) {
    //     intUnits[0]=(UChar)(i);
    //     length=1;
    } else {
        intUnits[0]=(UChar)(UCharsTrie::kMinTwoUnitValueLead+(i>>16));
        intUnits[1]=(UChar)i;
        length=2;
    }
    intUnits[0]=(UChar)(intUnits[0]|(isFinal<<15));
    return write(intUnits, length);
}